

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::~DBImpl(DBImpl *this)

{
  DBImpl *this_local;
  
  ~DBImpl(this);
  operator_delete(this);
  return;
}

Assistant:

DBImpl::~DBImpl() {
  // Wait for background work to finish
  mutex_.Lock();
  shutting_down_.Release_Store(this);  // Any non-NULL value is ok
  while (bg_compaction_scheduled_) {
    bg_cv_.Wait();
  }
  mutex_.Unlock();

  if (db_lock_!=NULL) {
    env_->UnlockFile(db_lock_);
  }

  delete versions_;
  if (mem_!=NULL) mem_->Unref();
  if (imm_!=NULL) imm_->Unref();
  delete tmp_batch_;
  delete log_;
  delete logfile_;
  delete table_cache_;

  if (owns_info_log_) {
    delete options_.info_log;
  }
  if (owns_cache_) {
    delete options_.block_cache;
  }
}